

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra_shortest_paths.hpp
# Opt level: O0

void boost::detail::
     dijkstra_dispatch1<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::param_not_found,boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,boost::bgl_named_params<boost::detail::_project2nd<double,double>,boost::distance_combine_t,boost::bgl_named_params<std::less<double>,boost::distance_compare_t,boost::bgl_named_params<boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::edge_weight_t,boost::bgl_named_params<unsigned_long*,boost::vertex_predecessor_t,boost::no_property>>>>>
               (undefined8 param_1,undefined8 param_2,undefined4 param_3,
               iterator_property_map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_double,_double_&>
               *param_4)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  iterator iVar4;
  reference pvVar5;
  param_not_found *extraout_RDX;
  vector<double,_std::allocator<double>_> distance_map;
  size_type n;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff28;
  allocator_type *in_stack_ffffffffffffff40;
  vector<double,_std::allocator<double>_> *this;
  size_type in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *local_a0;
  iterator_property_map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_double,_double_&>
  *local_80 [2];
  iterator_property_map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_double,_double_&>
  *local_70;
  vector<double,_std::allocator<double>_> local_48;
  vector<double,_std::allocator<double>_> *local_30;
  iterator_property_map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_double,_double_&>
  *local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined4 local_8;
  
  local_28 = param_4;
  local_20 = param_2;
  local_18 = param_1;
  local_8 = param_3;
  bVar3 = is_default_param((param_not_found *)&stack0xffffffffffffffff);
  if (bVar3) {
    local_a0 = (vector<double,_std::allocator<double>_> *)
               num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>::config>>
                         ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config>_>
                           *)in_stack_ffffffffffffff40);
  }
  else {
    local_a0 = (vector<double,_std::allocator<double>_> *)0x1;
  }
  local_30 = local_a0;
  std::allocator<double>::allocator((allocator<double> *)0xb6ee65);
  std::vector<double,_std::allocator<double>_>::vector
            (local_a0,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::allocator<double>::~allocator((allocator<double> *)0xb6ee8b);
  uVar2 = local_18;
  uVar1 = local_20;
  this = &local_48;
  iVar4 = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this,0);
  local_80[0] = make_iterator_property_map<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>>
                          (*pvVar5,iVar4._M_current);
  local_70 = choose_param<boost::iterator_property_map<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,double,double&>>
                       ((iterator_property_map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_double,_double_&>
                         *)&stack0xffffffffffffffff,(boost *)local_80,extraout_RDX,param_4);
  dijkstra_dispatch2<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::iterator_property_map<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,double,double&>,boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,boost::bgl_named_params<boost::detail::_project2nd<double,double>,boost::distance_combine_t,boost::bgl_named_params<std::less<double>,boost::distance_compare_t,boost::bgl_named_params<boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::edge_weight_t,boost::bgl_named_params<unsigned_long*,boost::vertex_predecessor_t,boost::no_property>>>>>
            (uVar2,uVar1,local_70,local_8,local_28);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  return;
}

Assistant:

inline void
    dijkstra_dispatch1
      (const VertexListGraph& g,
       typename graph_traits<VertexListGraph>::vertex_descriptor s,
       DistanceMap distance, WeightMap weight, IndexMap index_map,
       const Params& params)
    {
      // Default for distance map
      typedef typename property_traits<WeightMap>::value_type D;
      typename std::vector<D>::size_type
        n = is_default_param(distance) ? num_vertices(g) : 1;
      std::vector<D> distance_map(n);

      detail::dijkstra_dispatch2
        (g, s, choose_param(distance, make_iterator_property_map
                            (distance_map.begin(), index_map,
                             distance_map[0])),
         weight, index_map, params);
    }